

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.c
# Opt level: O1

void BrotliConvertBitDepthsToSymbols(uint8_t *depth,size_t len,uint16_t *bits)

{
  byte bVar1;
  size_t sVar2;
  long lVar3;
  uint16_t uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  short sStack_4a;
  ulong uStack_48;
  uint16_t bl_count [16];
  uint16_t next_code [16];
  
  bl_count[4] = 0;
  bl_count[5] = 0;
  bl_count[6] = 0;
  bl_count[7] = 0;
  bl_count[8] = 0;
  bl_count[9] = 0;
  bl_count[10] = 0;
  bl_count[0xb] = 0;
  uStack_48 = 0;
  bl_count[0] = 0;
  bl_count[1] = 0;
  bl_count[2] = 0;
  bl_count[3] = 0;
  if (len != 0) {
    sVar2 = 0;
    do {
      bl_count[(ulong)depth[sVar2] - 4] = bl_count[(ulong)depth[sVar2] - 4] + 1;
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
  }
  uVar4 = 0;
  uStack_48 = uStack_48 & 0xffffffffffff0000;
  bl_count[0xc] = 0;
  lVar3 = 1;
  do {
    uVar4 = ((&sStack_4a)[lVar3] + uVar4) * 2;
    bl_count[lVar3 + 0xc] = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  if (len != 0) {
    sVar2 = 0;
    do {
      bVar1 = depth[sVar2];
      uVar5 = (ulong)bVar1;
      if (uVar5 != 0) {
        uVar7 = (uint)bl_count[uVar5 + 0xc];
        bl_count[uVar5 + 0xc] = bl_count[uVar5 + 0xc] + 1;
        uVar6 = *(ulong *)(BrotliReverseBits_kLut + (ulong)(uVar7 & 0xf) * 8);
        if (4 < bVar1) {
          uVar8 = 4;
          do {
            uVar7 = uVar7 >> 4;
            uVar6 = uVar6 << 4 | *(ulong *)(BrotliReverseBits_kLut + (ulong)(uVar7 & 0xf) * 8);
            uVar8 = uVar8 + 4;
          } while (uVar8 < uVar5);
        }
        bits[sVar2] = (uint16_t)(uVar6 >> (-bVar1 & 3));
      }
      sVar2 = sVar2 + 1;
    } while (sVar2 != len);
  }
  return;
}

Assistant:

void BrotliConvertBitDepthsToSymbols(const uint8_t* depth,
                                     size_t len,
                                     uint16_t* bits) {
  /* In Brotli, all bit depths are [1..15]
     0 bit depth means that the symbol does not exist. */
  uint16_t bl_count[MAX_HUFFMAN_BITS] = { 0 };
  uint16_t next_code[MAX_HUFFMAN_BITS];
  size_t i;
  int code = 0;
  for (i = 0; i < len; ++i) {
    ++bl_count[depth[i]];
  }
  bl_count[0] = 0;
  next_code[0] = 0;
  for (i = 1; i < MAX_HUFFMAN_BITS; ++i) {
    code = (code + bl_count[i - 1]) << 1;
    next_code[i] = (uint16_t)code;
  }
  for (i = 0; i < len; ++i) {
    if (depth[i]) {
      bits[i] = BrotliReverseBits(depth[i], next_code[depth[i]]++);
    }
  }
}